

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

ValueInfo * __thiscall
GlobOptBlockData::MergeValueInfo
          (GlobOptBlockData *this,Value *toDataVal,Value *fromDataVal,Sym *fromDataSym,
          bool isLoopBackEdge,bool sameValueNumber,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  ValueType *this_00;
  ValueType *this_01;
  ValueType valueType;
  ValueInfo *this_02;
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  JsTypeValueInfo *pJVar6;
  JsTypeValueInfo *fromValueInfo;
  ValueInfo *pVVar7;
  ArrayValueInfo *toDataValueInfo;
  ArrayValueInfo *fromDataValueInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType merged;
  ValueType newValueType;
  
  pVVar7 = toDataVal->valueInfo;
  this_02 = fromDataVal->valueInfo;
  bVar3 = ValueInfo::IsJsType(pVVar7);
  if ((bVar3) || (bVar3 = ValueInfo::IsJsType(this_02), bVar3)) {
    bVar3 = ValueInfo::IsJsType(pVVar7);
    if ((!bVar3) || (bVar3 = ValueInfo::IsJsType(this_02), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x3b0,"(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType())",
                         "toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pJVar6 = ValueInfo::AsJsType(pVVar7);
    fromValueInfo = ValueInfo::AsJsType(this_02);
    pJVar6 = MergeJsTypeValueInfo(this,pJVar6,fromValueInfo,isLoopBackEdge,sameValueNumber);
    return &pJVar6->super_ValueInfo;
  }
  if (pVVar7 == this_02) {
    return pVVar7;
  }
  this_00 = &pVVar7->super_ValueType;
  valueType.field_0 =
       (anon_union_2_4_ea848c7b_for_ValueType_13)
       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_02->super_ValueType).field_0.field_0;
  ValueType::Verify((ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVVar7->super_ValueType).field_0.field_0);
  ValueType::Verify(valueType);
  bVar3 = ValueType::operator==(this_00,valueType);
  if (bVar3) {
    local_32[0].field_0 = (this_00->field_0).field_0;
  }
  else {
    ValueType::ValueType
              ((ValueType *)&local_34.field_0,(this_00->field_0).bits | (ushort)valueType.field_0);
    bVar3 = ValueType::OneOn((ValueType *)&local_34.field_0,Object);
    if (bVar3) {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::MergeWithObject(this_00,valueType);
    }
    else {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::Verify(local_34.field_0);
    }
  }
  bVar3 = ValueType::IsLikelyInt((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    pVVar7 = ValueInfo::MergeLikelyIntValueInfo
                       (this->globOpt->alloc,toDataVal,fromDataVal,(ValueType)local_32[0].field_0);
    return pVVar7;
  }
  bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (!bVar3) goto LAB_0049986c;
  bVar3 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if ((bVar3) && (bVar3 = ValueType::IsLikelyArrayOrObjectWithArray(this_00), bVar3)) {
    this_01 = &this_02->super_ValueType;
    bVar3 = ValueType::IsLikelyArrayOrObjectWithArray(this_01);
    if (bVar3) {
      bVar3 = ValueType::HasNoMissingValues(this_00);
      if (bVar3) {
        bVar3 = ValueType::HasNoMissingValues(this_01);
      }
      else {
        bVar3 = false;
      }
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_32[0].field_0,bVar3);
      bVar3 = ValueType::HasIntElements(this_00);
      bVar4 = ValueType::HasIntElements(this_01);
      if (bVar3 == bVar4) {
        bVar3 = ValueType::HasFloatElements(this_00);
        bVar4 = ValueType::HasFloatElements(this_01);
        if (bVar3 == bVar4) goto LAB_00499802;
      }
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_32[0].field_0);
    }
  }
LAB_00499802:
  bVar3 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
  if (((bVar3) && (bVar3 = ValueInfo::IsArrayValueInfo(pVVar7), bVar3)) &&
     (bVar3 = ValueInfo::IsArrayValueInfo(this_02), aVar2 = local_32[0], bVar3)) {
    toDataValueInfo = ValueInfo::AsArrayValueInfo(pVVar7);
    fromDataValueInfo = ValueInfo::AsArrayValueInfo(this_02);
    pVVar7 = MergeArrayValueInfo(this,(ValueType)aVar2.field_0,toDataValueInfo,fromDataValueInfo,
                                 fromDataSym,symsRequiringCompensation,symsCreatedForMerge,
                                 isLoopBackEdge);
    return pVVar7;
  }
LAB_0049986c:
  aVar2 = local_32[0];
  pVVar7 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,this->globOpt->alloc,0x3f1274);
  ValueInfo::ValueInfo(pVVar7,(ValueType)aVar2.field_0,Generic);
  return pVVar7;
}

Assistant:

ValueInfo *
GlobOptBlockData::MergeValueInfo(
    Value *toDataVal,
    Value *fromDataVal,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool sameValueNumber,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    ValueInfo *const toDataValueInfo = toDataVal->GetValueInfo();
    ValueInfo *const fromDataValueInfo = fromDataVal->GetValueInfo();

    if (toDataValueInfo->IsJsType() || fromDataValueInfo->IsJsType())
    {
        Assert(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType());
        return this->MergeJsTypeValueInfo(toDataValueInfo->AsJsType(), fromDataValueInfo->AsJsType(), isLoopBackEdge, sameValueNumber);
    }

    // Same value
    if (toDataValueInfo == fromDataValueInfo)
    {
        return toDataValueInfo;
    }

    ValueType newValueType(toDataValueInfo->Type().Merge(fromDataValueInfo->Type()));
    if (newValueType.IsLikelyInt())
    {
        return ValueInfo::MergeLikelyIntValueInfo(this->globOpt->alloc, toDataVal, fromDataVal, newValueType);
    }
    if(newValueType.IsLikelyAnyOptimizedArray())
    {
        if(newValueType.IsLikelyArrayOrObjectWithArray() &&
            toDataValueInfo->IsLikelyArrayOrObjectWithArray() &&
            fromDataValueInfo->IsLikelyArrayOrObjectWithArray())
        {
            // Value type merge for missing values is aggressive by default (for profile data) - if either side likely has no
            // missing values, then the merged value type also likely has no missing values. This is because arrays often start
            // off having missing values but are eventually filled up. In GlobOpt however, we need to be conservative because
            // the existence of a value type that likely has missing values indicates that it is more likely for it to have
            // missing values than not. Also, StElems that are likely to create missing values are tracked in profile data and
            // will update value types to say they are now likely to have missing values, and that needs to be propagated
            // conservatively.
            newValueType =
                newValueType.SetHasNoMissingValues(
                    toDataValueInfo->HasNoMissingValues() && fromDataValueInfo->HasNoMissingValues());

            if(toDataValueInfo->HasIntElements() != fromDataValueInfo->HasIntElements() ||
                toDataValueInfo->HasFloatElements() != fromDataValueInfo->HasFloatElements())
            {
                // When merging arrays with different native storage types, make the merged value type a likely version to force
                // array checks to be done again and cause a conversion and/or bailout as necessary
                newValueType = newValueType.ToLikely();
            }
        }

        if(!(newValueType.IsObject() && toDataValueInfo->IsArrayValueInfo() && fromDataValueInfo->IsArrayValueInfo()))
        {
            return ValueInfo::New(this->globOpt->alloc, newValueType);
        }

        return
            this->MergeArrayValueInfo(
                newValueType,
                toDataValueInfo->AsArrayValueInfo(),
                fromDataValueInfo->AsArrayValueInfo(),
                fromDataSym,
                symsRequiringCompensation,
                symsCreatedForMerge,
                isLoopBackEdge);
    }

    // Consider: If both values are VarConstantValueInfo with the same value, we could
    // merge them preserving the value.
    return ValueInfo::New(this->globOpt->alloc, newValueType);
}